

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_265da4::SndioPlayback::open(SndioPlayback *this,char *__file,int __oflag,...)

{
  int iVar1;
  backend_exception *this_00;
  sio_hdl *psVar2;
  
  if ((__file == (char *)0x0) || (iVar1 = strcmp(__file,"SndIO Default"), iVar1 == 0)) {
    psVar2 = (sio_hdl *)sio_open(0,1,0);
    this->mSndHandle = psVar2;
    if (psVar2 != (sio_hdl *)0x0) {
      iVar1 = std::__cxx11::string::assign((char *)&((this->super_BackendBase).mDevice)->DeviceName)
      ;
      return iVar1;
    }
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_00,0xa004,"Could not open backend device");
  }
  else {
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file);
  }
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void SndioPlayback::open(const ALCchar *name)
{
    if(!name)
        name = sndio_device;
    else if(strcmp(name, sndio_device) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mSndHandle = sio_open(nullptr, SIO_PLAY, 0);
    if(mSndHandle == nullptr)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open backend device"};

    mDevice->DeviceName = name;
}